

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

void Js::RegexHelper::PropagateLastMatchToCtor
               (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
               JavascriptString *lastInput,GroupInfo lastSuccessfulMatch,bool useSplitPattern)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptLibrary *this;
  JavascriptRegExpConstructor *this_00;
  RegexPattern *local_48;
  RegexPattern *pattern;
  bool useSplitPattern_local;
  JavascriptString *lastInput_local;
  JavascriptRegExp *regularExpression_local;
  ScriptContext *scriptContext_local;
  GroupInfo lastSuccessfulMatch_local;
  
  scriptContext_local = (ScriptContext *)lastSuccessfulMatch;
  if (lastInput == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x82d,"(lastInput)","lastInput");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = UnifiedRegex::GroupInfo::IsUndefined((GroupInfo *)&scriptContext_local);
  if (!bVar2) {
    if (useSplitPattern) {
      local_48 = JavascriptRegExp::GetSplitPattern(regularExpression);
    }
    else {
      local_48 = JavascriptRegExp::GetPattern(regularExpression);
    }
    this = ScriptContext::GetLibrary(scriptContext);
    this_00 = JavascriptLibraryBase::GetRegExpConstructor(&this->super_JavascriptLibraryBase);
    JavascriptRegExpConstructor::SetLastMatch
              (this_00,local_48,lastInput,(GroupInfo)scriptContext_local);
  }
  return;
}

Assistant:

void RegexHelper::PropagateLastMatchToCtor
        ( ScriptContext* scriptContext
        , JavascriptRegExp* regularExpression
        , JavascriptString* lastInput
        , UnifiedRegex::GroupInfo lastSuccessfulMatch
        , bool useSplitPattern )
    {
        Assert(lastInput);

        if (!lastSuccessfulMatch.IsUndefined())
        {
            // Notes:
            // - SPEC DEVIATION: The RegExp ctor holds some details of the last successful match on any regular expression.
            // - For updating regex ctor's stats we are using entry function's context, rather than regex context,
            //   the rational is: use same context of RegExp.prototype, on which the function was called.
            //   So, if you call the function with remoteContext.regexInstance.exec.call(localRegexInstance, "match string"),
            //   we will update stats in the context related to the exec function, i.e. remoteContext.
            //   This is consistent with other browsers
            UnifiedRegex::RegexPattern* pattern = useSplitPattern
                ? regularExpression->GetSplitPattern()
                : regularExpression->GetPattern();
            scriptContext->GetLibrary()->GetRegExpConstructor()->SetLastMatch(pattern, lastInput, lastSuccessfulMatch);
        }
    }